

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O2

Vec_Int_t * Saig_StrSimPerformMatching_hack(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  Aig_Obj_t *pObj;
  int i;
  
  p = Vec_IntAlloc(100);
  for (i = 0; i < p0->vObjs->nSize; i = i + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,i);
    if (pObj != (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjIsConst1(pObj);
      if (((iVar1 != 0) || (uVar2 = (uint)*(undefined8 *)&pObj->field_0x18, (uVar2 & 7) == 2)) ||
         (0xfffffffd < (uVar2 & 7) - 7)) {
        Vec_IntPush(p,i);
        Vec_IntPush(p,i);
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Saig_StrSimPerformMatching_hack( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Int_t * vPairs;
    Aig_Obj_t * pObj;
    int i;
    // create array of pairs
    vPairs = Vec_IntAlloc( 100 );
    Aig_ManForEachObj( p0, pObj, i )
    {
        if ( !Aig_ObjIsConst1(pObj) && !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        Vec_IntPush( vPairs, i );
        Vec_IntPush( vPairs, i );
    }
    return vPairs;
}